

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int advance(dwarf_buf *buf,size_t count)

{
  int iVar1;
  
  if (buf->left < count) {
    iVar1 = 0;
    if (buf->reported_underflow == 0) {
      iVar1 = 0;
      dwarf_buf_error(buf,"DWARF underflow",0);
      buf->reported_underflow = 1;
    }
  }
  else {
    buf->buf = buf->buf + count;
    buf->left = buf->left - count;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
advance (struct dwarf_buf *buf, size_t count)
{
  if (!require (buf, count))
    return 0;
  buf->buf += count;
  buf->left -= count;
  return 1;
}